

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

HighsStatus
readSolutionFile(string *filename,HighsOptions *options,HighsLp *lp,HighsBasis *basis,
                HighsSolution *solution,HighsInt style)

{
  HighsLp *pHVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  HighsStatus HVar5;
  size_type sVar6;
  size_type sVar7;
  pointer ppVar8;
  undefined8 uVar9;
  reference pvVar10;
  uint *in_RDX;
  long in_RSI;
  string *in_RDI;
  uint in_R9D;
  HighsStatus basis_read_status;
  HighsInt iRow_1;
  HighsInt iCol_3;
  double dual;
  HighsInt iRow;
  bool num_row_ok;
  HighsInt iCol_2;
  HighsInt iX;
  HighsInt iCol_1;
  HighsInt iCol;
  iterator search;
  HighsInt num_value;
  bool sparse;
  bool miplib_sol;
  string section_name;
  HighsBasis read_basis;
  HighsSolution read_solution;
  HighsInt lp_num_row;
  HighsInt lp_num_col;
  HighsInt num_row;
  HighsInt num_col;
  double value;
  string name;
  string keyword;
  ifstream in_file;
  HighsLogOptions *log_options;
  undefined4 in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffa9c;
  HighsStatus in_stack_fffffffffffffaa0;
  undefined4 in_stack_fffffffffffffaa4;
  undefined4 in_stack_fffffffffffffaa8;
  undefined4 in_stack_fffffffffffffaac;
  undefined4 uVar11;
  undefined4 in_stack_fffffffffffffab0;
  undefined4 in_stack_fffffffffffffab4;
  undefined4 uVar12;
  HighsSolution *in_stack_fffffffffffffab8;
  HighsStatus in_stack_fffffffffffffac0;
  undefined4 in_stack_fffffffffffffac4;
  undefined4 in_stack_fffffffffffffac8;
  undefined4 in_stack_fffffffffffffacc;
  HighsSolution *in_stack_fffffffffffffad0;
  HighsSolution *pHVar13;
  undefined4 in_stack_fffffffffffffad8;
  undefined4 in_stack_fffffffffffffadc;
  undefined4 in_stack_fffffffffffffae0;
  undefined4 in_stack_fffffffffffffae4;
  HighsInt in_stack_fffffffffffffb44;
  HighsLp *in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb54;
  HighsLp *in_stack_fffffffffffffb58;
  ifstream *in_stack_fffffffffffffb78;
  HighsLogOptions *pHVar14;
  HighsBasis *in_stack_fffffffffffffb80;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  in_stack_fffffffffffffb88;
  int local_3f0;
  int local_3ec;
  HighsSolution *local_3e8;
  int local_3dc;
  int local_3d4;
  int local_3d0;
  int local_3cc;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_3b8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_3b0;
  undefined8 local_3a8;
  int local_3a0;
  bool local_39a;
  byte local_399;
  string local_398 [128];
  undefined1 local_318;
  vector<double,_std::allocator<double>_> local_310;
  vector<double,_std::allocator<double>_> local_2f8;
  vector<double,_std::allocator<double>_> local_2e0;
  vector<double,_std::allocator<double>_> local_2c8;
  uint local_2b0;
  uint local_2ac;
  uint local_2a8;
  uint local_2a4;
  HighsLp *local_2a0;
  string local_298 [32];
  string local_278 [32];
  undefined4 local_258;
  undefined1 local_248 [520];
  HighsLogOptions *local_40;
  uint *local_20;
  HighsStatus local_4;
  
  local_40 = (HighsLogOptions *)(in_RSI + 0x380);
  if ((in_R9D != 0) && (in_R9D != 4)) {
    highsLogUser(local_40,kError,"readSolutionFile: Cannot read file of style %d\n",(ulong)in_R9D);
    return kError;
  }
  local_20 = in_RDX;
  std::ifstream::ifstream(local_248,in_RDI,_S_in);
  bVar2 = std::ios::fail();
  pHVar14 = local_40;
  if ((bVar2 & 1) != 0) {
    uVar9 = std::__cxx11::string::c_str();
    highsLogUser(pHVar14,kError,"readSolutionFile: Cannot open readable file \"%s\"\n",uVar9);
    local_4 = kError;
    local_258 = 1;
    goto LAB_00500577;
  }
  std::__cxx11::string::string(local_278);
  std::__cxx11::string::string(local_298);
  local_2ac = *local_20;
  local_2b0 = local_20[1];
  HighsSolution::HighsSolution
            (in_stack_fffffffffffffad0,
             (HighsSolution *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
  HighsBasis::HighsBasis
            ((HighsBasis *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
             (HighsBasis *)in_stack_fffffffffffffab8);
  HighsSolution::clear
            ((HighsSolution *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0));
  HighsBasis::clear((HighsBasis *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0));
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
             (size_type)in_stack_fffffffffffffab8);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
             (size_type)in_stack_fffffffffffffab8);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
             (size_type)in_stack_fffffffffffffab8);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
             (size_type)in_stack_fffffffffffffab8);
  std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
            ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
             CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
             (size_type)in_stack_fffffffffffffab8);
  std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
            ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
             CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
             (size_type)in_stack_fffffffffffffab8);
  std::__cxx11::string::string(local_398);
  bVar3 = readSolutionFileIdIgnoreLineOk
                    ((string *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
                     (ifstream *)0x4ff1d2);
  if (bVar3) {
    local_399 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                                (char *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98
                                                ));
    if ((bool)local_399) {
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(local_20 + 0x52));
      if (sVar6 == 0) {
        highsLogUser(local_40,kError,
                     "readSolutionFile: Cannot read a MIPLIB solution file without column names in the model\n"
                    );
        local_4 = kError;
        goto LAB_005004fe;
      }
      sVar7 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::size((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      *)0x4ff332);
      if (sVar7 == 0) {
        HighsNameHash::form((HighsNameHash *)
                            CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
      }
    }
    local_39a = false;
    if ((local_399 & 1) != 0) goto LAB_004ff71e;
    bVar3 = readSolutionFileIgnoreLineOk
                      ((ifstream *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
    if (bVar3) {
      bVar3 = readSolutionFileIgnoreLineOk
                        ((ifstream *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
      if (bVar3) {
        bVar3 = readSolutionFileIgnoreLineOk
                          ((ifstream *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98)
                          );
        if (bVar3) {
          bVar3 = readSolutionFileKeywordLineOk
                            ((string *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98)
                             ,(ifstream *)0x4ff48c);
          if (bVar3) {
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0)
                                    ,(char *)CONCAT44(in_stack_fffffffffffffa9c,
                                                      in_stack_fffffffffffffa98));
            if (bVar3) {
              local_4 = readSolutionFileReturn
                                  (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                                   (HighsBasis *)
                                   CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                                   (HighsSolution *)
                                   CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
                                   (HighsBasis *)
                                   CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                                   (ifstream *)
                                   CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
            }
            else {
              bVar3 = readSolutionFileIgnoreLineOk
                                ((ifstream *)
                                 CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
              if (bVar3) {
                bVar3 = readSolutionFileIgnoreLineOk
                                  ((ifstream *)
                                   CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
                if (bVar3) {
                  bVar3 = readSolutionFileHashKeywordIntLineOk
                                    ((string *)
                                     CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
                                     (HighsInt *)
                                     CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                                     (ifstream *)
                                     CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
                  if (bVar3) {
                    local_39a = (int)local_2a4 < 1;
                    if (local_39a) {
                      local_2a4 = -local_2a4;
                    }
                    else if (local_2a4 != local_2ac) {
                      highsLogUser(local_40,kError,
                                   "readSolutionFile: Solution file is for %d columns, not %d\n",
                                   (ulong)local_2a4,(ulong)local_2ac);
                      local_4 = readSolutionFileErrorReturn((ifstream *)0x4ff6f3);
                      goto LAB_005004fe;
                    }
LAB_004ff71e:
                    if ((local_399 & 1) == 0) {
                      if (local_39a == false) {
                        for (local_3d4 = 0; local_3d4 < (int)local_2a4; local_3d4 = local_3d4 + 1) {
                          bVar3 = readSolutionFileIdDoubleLineOk
                                            ((string *)
                                             CONCAT44(in_stack_fffffffffffffaac,
                                                      in_stack_fffffffffffffaa8),
                                             (double *)
                                             CONCAT44(in_stack_fffffffffffffaa4,
                                                      in_stack_fffffffffffffaa0),
                                             (ifstream *)
                                             CONCAT44(in_stack_fffffffffffffa9c,
                                                      in_stack_fffffffffffffa98));
                          in_stack_fffffffffffffb54 =
                               CONCAT13(bVar3,(int3)in_stack_fffffffffffffb54);
                          if (!bVar3) {
                            local_4 = readSolutionFileErrorReturn((ifstream *)0x4ffad5);
                            goto LAB_005004fe;
                          }
                          in_stack_fffffffffffffb48 = local_2a0;
                          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                              (&local_310,(long)local_3d4);
                          *pvVar10 = (value_type)in_stack_fffffffffffffb48;
                        }
                      }
                      else {
                        std::vector<double,_std::allocator<double>_>::assign
                                  ((vector<double,_std::allocator<double>_> *)
                                   CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                                   CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
                                   (value_type_conflict1 *)0x4ff99b);
                        for (local_3d0 = 0; local_3d0 < (int)local_2a4; local_3d0 = local_3d0 + 1) {
                          bVar3 = readSolutionFileIdDoubleIntLineOk
                                            ((double *)
                                             CONCAT44(in_stack_fffffffffffffadc,
                                                      in_stack_fffffffffffffad8),
                                             (HighsInt *)in_stack_fffffffffffffad0,
                                             (ifstream *)
                                             CONCAT44(in_stack_fffffffffffffacc,
                                                      in_stack_fffffffffffffac8));
                          if (!bVar3) {
                            local_4 = readSolutionFileErrorReturn((ifstream *)0x4ff9fc);
                            goto LAB_005004fe;
                          }
                          in_stack_fffffffffffffb58 = local_2a0;
                          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                              (&local_310,(long)local_3cc);
                          *pvVar10 = (value_type)in_stack_fffffffffffffb58;
                        }
                      }
                    }
                    else {
                      local_3a0 = 0;
                      local_3a8 = 0;
                      std::vector<double,_std::allocator<double>_>::assign
                                ((vector<double,_std::allocator<double>_> *)
                                 CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                                 CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
                                 (value_type_conflict1 *)0x4ff760);
                      do {
                        bVar3 = readSolutionFileIdDoubleLineOk
                                          ((string *)
                                           CONCAT44(in_stack_fffffffffffffaac,
                                                    in_stack_fffffffffffffaa8),
                                           (double *)
                                           CONCAT44(in_stack_fffffffffffffaa4,
                                                    in_stack_fffffffffffffaa0),
                                           (ifstream *)
                                           CONCAT44(in_stack_fffffffffffffa9c,
                                                    in_stack_fffffffffffffa98));
                        if (!bVar3) break;
                        in_stack_fffffffffffffb88._M_cur =
                             (__node_type *)
                             std::
                             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                     *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98)
                                    ,(key_type *)0x4ff7b8);
                        local_3b0._M_cur = in_stack_fffffffffffffb88._M_cur;
                        local_3b8._M_cur =
                             (__node_type *)
                             std::
                             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                    *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98))
                        ;
                        bVar3 = std::__detail::operator==(&local_3b0,&local_3b8);
                        if (bVar3) {
                          pHVar14 = local_40;
                          uVar9 = std::__cxx11::string::c_str();
                          highsLogUser(pHVar14,kError,"readSolutionFile: name %s is not found\n",
                                       uVar9);
                          local_4 = kError;
                          goto LAB_005004fe;
                        }
                        ppVar8 = std::__detail::
                                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                                               *)0x4ff86e);
                        if (ppVar8->second == -1) {
                          pHVar14 = local_40;
                          uVar9 = std::__cxx11::string::c_str();
                          highsLogUser(pHVar14,kError,"readSolutionFile: name %s is duplicated\n",
                                       uVar9);
                          local_4 = kError;
                          goto LAB_005004fe;
                        }
                        ppVar8 = std::__detail::
                                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                                               *)0x4ff8db);
                        pHVar1 = local_2a0;
                        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                            (&local_310,(long)ppVar8->second);
                        *pvVar10 = (value_type)pHVar1;
                        local_3a0 = local_3a0 + 1;
                        bVar2 = std::ios::eof();
                      } while ((bVar2 & 1) == 0);
                    }
                    local_318 = 1;
                    if ((local_39a & 1U) == 0) {
                      bVar3 = readSolutionFileHashKeywordIntLineOk
                                        ((string *)
                                         CONCAT44(in_stack_fffffffffffffaac,
                                                  in_stack_fffffffffffffaa8),
                                         (HighsInt *)
                                         CONCAT44(in_stack_fffffffffffffaa4,
                                                  in_stack_fffffffffffffaa0),
                                         (ifstream *)
                                         CONCAT44(in_stack_fffffffffffffa9c,
                                                  in_stack_fffffffffffffa98));
                      if (bVar3) {
                        bVar3 = local_2a8 == local_2b0;
                        for (local_3dc = 0; local_3dc < (int)local_2a8; local_3dc = local_3dc + 1) {
                          bVar4 = readSolutionFileIdDoubleLineOk
                                            ((string *)
                                             CONCAT44(in_stack_fffffffffffffaac,
                                                      in_stack_fffffffffffffaa8),
                                             (double *)
                                             CONCAT44(in_stack_fffffffffffffaa4,
                                                      in_stack_fffffffffffffaa0),
                                             (ifstream *)
                                             CONCAT44(in_stack_fffffffffffffa9c,
                                                      in_stack_fffffffffffffa98));
                          pHVar1 = local_2a0;
                          if (!bVar4) {
                            local_4 = readSolutionFileErrorReturn((ifstream *)0x4ffd96);
                            goto LAB_005004fe;
                          }
                          if (bVar3) {
                            pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                                (&local_2e0,(long)local_3dc);
                            *pvVar10 = (value_type)pHVar1;
                          }
                        }
                        if (!bVar3) {
                          highsLogUser(local_40,kWarning,
                                       "readSolutionFile: Solution file is for %d rows, not %d: row values ignored\n"
                                       ,(ulong)local_2a8,(ulong)local_2b0);
                          HVar5 = calculateRowValuesQuad
                                            (in_stack_fffffffffffffb58,
                                             (vector<double,_std::allocator<double>_> *)
                                             CONCAT44(in_stack_fffffffffffffb54,
                                                      in_stack_fffffffffffffb50),
                                             (vector<double,_std::allocator<double>_> *)
                                             in_stack_fffffffffffffb48,in_stack_fffffffffffffb44);
                          if (HVar5 != kOk) {
                            local_4 = readSolutionFileErrorReturn((ifstream *)0x4ffe8f);
                            goto LAB_005004fe;
                          }
                        }
                        bVar3 = readSolutionFileIgnoreLineOk
                                          ((ifstream *)
                                           CONCAT44(in_stack_fffffffffffffa9c,
                                                    in_stack_fffffffffffffa98));
                        if (bVar3) {
                          bVar3 = readSolutionFileIgnoreLineOk
                                            ((ifstream *)
                                             CONCAT44(in_stack_fffffffffffffa9c,
                                                      in_stack_fffffffffffffa98));
                          if (bVar3) {
                            bVar3 = readSolutionFileIgnoreLineOk
                                              ((ifstream *)
                                               CONCAT44(in_stack_fffffffffffffa9c,
                                                        in_stack_fffffffffffffa98));
                            if (bVar3) {
                              bVar3 = readSolutionFileKeywordLineOk
                                                ((string *)
                                                 CONCAT44(in_stack_fffffffffffffa9c,
                                                          in_stack_fffffffffffffa98),
                                                 (ifstream *)0x50000e);
                              if (bVar3) {
                                bVar3 = std::operator!=((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT44(in_stack_fffffffffffffaa4,
                                                             in_stack_fffffffffffffaa0),
                                                  (char *)CONCAT44(in_stack_fffffffffffffa9c,
                                                                   in_stack_fffffffffffffa98));
                                if (bVar3) {
                                  bVar3 = readSolutionFileIgnoreLineOk
                                                    ((ifstream *)
                                                     CONCAT44(in_stack_fffffffffffffa9c,
                                                              in_stack_fffffffffffffa98));
                                  if (bVar3) {
                                    bVar3 = readSolutionFileHashKeywordIntLineOk
                                                      ((string *)
                                                       CONCAT44(in_stack_fffffffffffffaac,
                                                                in_stack_fffffffffffffaa8),
                                                       (HighsInt *)
                                                       CONCAT44(in_stack_fffffffffffffaa4,
                                                                in_stack_fffffffffffffaa0),
                                                       (ifstream *)
                                                       CONCAT44(in_stack_fffffffffffffa9c,
                                                                in_stack_fffffffffffffa98));
                                    if (bVar3) {
                                      for (local_3ec = 0; local_3ec < (int)local_2a4;
                                          local_3ec = local_3ec + 1) {
                                        bVar3 = readSolutionFileIdDoubleLineOk
                                                          ((string *)
                                                           CONCAT44(in_stack_fffffffffffffaac,
                                                                    in_stack_fffffffffffffaa8),
                                                           (double *)
                                                           CONCAT44(in_stack_fffffffffffffaa4,
                                                                    in_stack_fffffffffffffaa0),
                                                           (ifstream *)
                                                           CONCAT44(in_stack_fffffffffffffa9c,
                                                                    in_stack_fffffffffffffa98));
                                        if (!bVar3) {
                                          local_4 = readSolutionFileErrorReturn
                                                              ((ifstream *)0x500194);
                                          goto LAB_005004fe;
                                        }
                                        pHVar13 = local_3e8;
                                        pvVar10 = std::vector<double,_std::allocator<double>_>::
                                                  operator[](&local_2f8,(long)local_3ec);
                                        *pvVar10 = (value_type)pHVar13;
                                      }
                                      bVar3 = readSolutionFileHashKeywordIntLineOk
                                                        ((string *)
                                                         CONCAT44(in_stack_fffffffffffffaac,
                                                                  in_stack_fffffffffffffaa8),
                                                         (HighsInt *)
                                                         CONCAT44(in_stack_fffffffffffffaa4,
                                                                  in_stack_fffffffffffffaa0),
                                                         (ifstream *)
                                                         CONCAT44(in_stack_fffffffffffffa9c,
                                                                  in_stack_fffffffffffffa98));
                                      if (bVar3) {
                                        for (local_3f0 = 0; local_3f0 < (int)local_2a8;
                                            local_3f0 = local_3f0 + 1) {
                                          bVar3 = readSolutionFileIdDoubleLineOk
                                                            ((string *)
                                                             CONCAT44(in_stack_fffffffffffffaac,
                                                                      in_stack_fffffffffffffaa8),
                                                             (double *)
                                                             CONCAT44(in_stack_fffffffffffffaa4,
                                                                      in_stack_fffffffffffffaa0),
                                                             (ifstream *)
                                                             CONCAT44(in_stack_fffffffffffffa9c,
                                                                      in_stack_fffffffffffffa98));
                                          if (!bVar3) {
                                            local_4 = readSolutionFileErrorReturn
                                                                ((ifstream *)0x5002d3);
                                            goto LAB_005004fe;
                                          }
                                          in_stack_fffffffffffffab8 = local_3e8;
                                          pvVar10 = std::vector<double,_std::allocator<double>_>::
                                                    operator[](&local_2c8,(long)local_3f0);
                                          *pvVar10 = (value_type)in_stack_fffffffffffffab8;
                                        }
                                        goto LAB_0050033e;
                                      }
                                      local_4 = readSolutionFileReturn
                                                          (in_stack_fffffffffffffac0,
                                                           in_stack_fffffffffffffab8,
                                                           (HighsBasis *)
                                                           CONCAT44(in_stack_fffffffffffffab4,
                                                                    in_stack_fffffffffffffab0),
                                                           (HighsSolution *)
                                                           CONCAT44(in_stack_fffffffffffffaac,
                                                                    in_stack_fffffffffffffaa8),
                                                           (HighsBasis *)
                                                           CONCAT44(in_stack_fffffffffffffaa4,
                                                                    in_stack_fffffffffffffaa0),
                                                           (ifstream *)
                                                           CONCAT44(in_stack_fffffffffffffa9c,
                                                                    in_stack_fffffffffffffa98));
                                    }
                                    else {
                                      local_4 = readSolutionFileReturn
                                                          (in_stack_fffffffffffffac0,
                                                           in_stack_fffffffffffffab8,
                                                           (HighsBasis *)
                                                           CONCAT44(in_stack_fffffffffffffab4,
                                                                    in_stack_fffffffffffffab0),
                                                           (HighsSolution *)
                                                           CONCAT44(in_stack_fffffffffffffaac,
                                                                    in_stack_fffffffffffffaa8),
                                                           (HighsBasis *)
                                                           CONCAT44(in_stack_fffffffffffffaa4,
                                                                    in_stack_fffffffffffffaa0),
                                                           (ifstream *)
                                                           CONCAT44(in_stack_fffffffffffffa9c,
                                                                    in_stack_fffffffffffffa98));
                                    }
                                  }
                                  else {
                                    local_4 = readSolutionFileErrorReturn((ifstream *)0x50009d);
                                  }
                                }
                                else {
LAB_0050033e:
                                  bVar3 = readSolutionFileIgnoreLineOk
                                                    ((ifstream *)
                                                     CONCAT44(in_stack_fffffffffffffa9c,
                                                              in_stack_fffffffffffffa98));
                                  uVar12 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffab4);
                                  if (bVar3) {
                                    bVar3 = readSolutionFileIgnoreLineOk
                                                      ((ifstream *)
                                                       CONCAT44(in_stack_fffffffffffffa9c,
                                                                in_stack_fffffffffffffa98));
                                    uVar11 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffaac);
                                    if (bVar3) {
                                      bVar3 = readSolutionFileIgnoreLineOk
                                                        ((ifstream *)
                                                         CONCAT44(in_stack_fffffffffffffa9c,
                                                                  in_stack_fffffffffffffa98));
                                      in_stack_fffffffffffffaa4 =
                                           CONCAT13(bVar3,(int3)in_stack_fffffffffffffaa4);
                                      if (bVar3) {
                                        HVar5 = readBasisStream((HighsLogOptions *)
                                                                in_stack_fffffffffffffb88._M_cur,
                                                                in_stack_fffffffffffffb80,
                                                                in_stack_fffffffffffffb78);
                                        local_4 = readSolutionFileReturn
                                                            (in_stack_fffffffffffffac0,
                                                             in_stack_fffffffffffffab8,
                                                             (HighsBasis *)
                                                             CONCAT44(uVar12,
                                                  in_stack_fffffffffffffab0),
                                                  (HighsSolution *)
                                                  CONCAT44(uVar11,in_stack_fffffffffffffaa8),
                                                  (HighsBasis *)
                                                  CONCAT44(in_stack_fffffffffffffaa4,
                                                           in_stack_fffffffffffffaa0),
                                                  (ifstream *)
                                                  CONCAT44(HVar5,in_stack_fffffffffffffa98));
                                      }
                                      else {
                                        in_stack_fffffffffffffaa0 =
                                             readSolutionFileReturn
                                                       (in_stack_fffffffffffffac0,
                                                        in_stack_fffffffffffffab8,
                                                        (HighsBasis *)
                                                        CONCAT44(uVar12,in_stack_fffffffffffffab0),
                                                        (HighsSolution *)
                                                        CONCAT44(uVar11,in_stack_fffffffffffffaa8),
                                                        (HighsBasis *)
                                                        CONCAT44(in_stack_fffffffffffffaa4,
                                                                 in_stack_fffffffffffffaa0),
                                                        (ifstream *)
                                                        CONCAT44(in_stack_fffffffffffffa9c,
                                                                 in_stack_fffffffffffffa98));
                                        local_4 = in_stack_fffffffffffffaa0;
                                      }
                                    }
                                    else {
                                      local_4 = readSolutionFileReturn
                                                          (in_stack_fffffffffffffac0,
                                                           in_stack_fffffffffffffab8,
                                                           (HighsBasis *)
                                                           CONCAT44(uVar12,in_stack_fffffffffffffab0
                                                                   ),
                                                           (HighsSolution *)
                                                           CONCAT44(uVar11,in_stack_fffffffffffffaa8
                                                                   ),
                                                           (HighsBasis *)
                                                           CONCAT44(in_stack_fffffffffffffaa4,
                                                                    in_stack_fffffffffffffaa0),
                                                           (ifstream *)
                                                           CONCAT44(in_stack_fffffffffffffa9c,
                                                                    in_stack_fffffffffffffa98));
                                    }
                                  }
                                  else {
                                    local_4 = readSolutionFileReturn
                                                        (in_stack_fffffffffffffac0,
                                                         in_stack_fffffffffffffab8,
                                                         (HighsBasis *)
                                                         CONCAT44(uVar12,in_stack_fffffffffffffab0),
                                                         (HighsSolution *)
                                                         CONCAT44(in_stack_fffffffffffffaac,
                                                                  in_stack_fffffffffffffaa8),
                                                         (HighsBasis *)
                                                         CONCAT44(in_stack_fffffffffffffaa4,
                                                                  in_stack_fffffffffffffaa0),
                                                         (ifstream *)
                                                         CONCAT44(in_stack_fffffffffffffa9c,
                                                                  in_stack_fffffffffffffa98));
                                  }
                                }
                              }
                              else {
                                local_4 = readSolutionFileErrorReturn((ifstream *)0x50002b);
                              }
                            }
                            else {
                              local_4 = readSolutionFileReturn
                                                  (in_stack_fffffffffffffac0,
                                                   in_stack_fffffffffffffab8,
                                                   (HighsBasis *)
                                                   CONCAT44(in_stack_fffffffffffffab4,
                                                            in_stack_fffffffffffffab0),
                                                   (HighsSolution *)
                                                   CONCAT44(in_stack_fffffffffffffaac,
                                                            in_stack_fffffffffffffaa8),
                                                   (HighsBasis *)
                                                   CONCAT44(in_stack_fffffffffffffaa4,
                                                            in_stack_fffffffffffffaa0),
                                                   (ifstream *)
                                                   CONCAT44(in_stack_fffffffffffffa9c,
                                                            in_stack_fffffffffffffa98));
                            }
                          }
                          else {
                            local_4 = readSolutionFileReturn
                                                (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8
                                                 ,(HighsBasis *)
                                                  CONCAT44(in_stack_fffffffffffffab4,
                                                           in_stack_fffffffffffffab0),
                                                 (HighsSolution *)
                                                 CONCAT44(in_stack_fffffffffffffaac,
                                                          in_stack_fffffffffffffaa8),
                                                 (HighsBasis *)
                                                 CONCAT44(in_stack_fffffffffffffaa4,
                                                          in_stack_fffffffffffffaa0),
                                                 (ifstream *)
                                                 CONCAT44(in_stack_fffffffffffffa9c,
                                                          in_stack_fffffffffffffa98));
                          }
                        }
                        else {
                          local_4 = readSolutionFileReturn
                                              (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                                               (HighsBasis *)
                                               CONCAT44(in_stack_fffffffffffffab4,
                                                        in_stack_fffffffffffffab0),
                                               (HighsSolution *)
                                               CONCAT44(in_stack_fffffffffffffaac,
                                                        in_stack_fffffffffffffaa8),
                                               (HighsBasis *)
                                               CONCAT44(in_stack_fffffffffffffaa4,
                                                        in_stack_fffffffffffffaa0),
                                               (ifstream *)
                                               CONCAT44(in_stack_fffffffffffffa9c,
                                                        in_stack_fffffffffffffa98));
                        }
                      }
                      else {
                        HVar5 = calculateRowValuesQuad
                                          (in_stack_fffffffffffffb58,
                                           (vector<double,_std::allocator<double>_> *)
                                           CONCAT44(in_stack_fffffffffffffb54,
                                                    in_stack_fffffffffffffb50),
                                           (vector<double,_std::allocator<double>_> *)
                                           in_stack_fffffffffffffb48,in_stack_fffffffffffffb44);
                        if (HVar5 == kOk) {
                          local_4 = readSolutionFileReturn
                                              (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                                               (HighsBasis *)
                                               CONCAT44(in_stack_fffffffffffffab4,
                                                        in_stack_fffffffffffffab0),
                                               (HighsSolution *)
                                               CONCAT44(in_stack_fffffffffffffaac,
                                                        in_stack_fffffffffffffaa8),
                                               (HighsBasis *)
                                               CONCAT44(in_stack_fffffffffffffaa4,
                                                        in_stack_fffffffffffffaa0),
                                               (ifstream *)
                                               CONCAT44(in_stack_fffffffffffffa9c,
                                                        in_stack_fffffffffffffa98));
                        }
                        else {
                          local_4 = readSolutionFileErrorReturn((ifstream *)0x4ffca0);
                        }
                      }
                    }
                    else {
                      HVar5 = calculateRowValuesQuad
                                        (in_stack_fffffffffffffb58,
                                         (vector<double,_std::allocator<double>_> *)
                                         CONCAT44(in_stack_fffffffffffffb54,
                                                  in_stack_fffffffffffffb50),
                                         (vector<double,_std::allocator<double>_> *)
                                         in_stack_fffffffffffffb48,in_stack_fffffffffffffb44);
                      if (HVar5 == kOk) {
                        local_4 = readSolutionFileReturn
                                            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                                             (HighsBasis *)
                                             CONCAT44(in_stack_fffffffffffffab4,
                                                      in_stack_fffffffffffffab0),
                                             (HighsSolution *)
                                             CONCAT44(in_stack_fffffffffffffaac,
                                                      in_stack_fffffffffffffaa8),
                                             (HighsBasis *)
                                             CONCAT44(in_stack_fffffffffffffaa4,
                                                      in_stack_fffffffffffffaa0),
                                             (ifstream *)
                                             CONCAT44(in_stack_fffffffffffffa9c,
                                                      in_stack_fffffffffffffa98));
                      }
                      else {
                        local_4 = readSolutionFileErrorReturn((ifstream *)0x4ffba8);
                      }
                    }
                  }
                  else {
                    local_4 = readSolutionFileErrorReturn((ifstream *)0x4ff647);
                  }
                }
                else {
                  local_4 = readSolutionFileErrorReturn((ifstream *)0x4ff5e0);
                }
              }
              else {
                local_4 = readSolutionFileErrorReturn((ifstream *)0x4ff589);
              }
            }
          }
          else {
            local_4 = readSolutionFileErrorReturn((ifstream *)0x4ff4af);
          }
        }
        else {
          local_4 = readSolutionFileErrorReturn((ifstream *)0x4ff450);
        }
      }
      else {
        local_4 = readSolutionFileErrorReturn((ifstream *)0x4ff3f9);
      }
    }
    else {
      local_4 = readSolutionFileErrorReturn((ifstream *)0x4ff3a2);
    }
  }
  else {
    local_4 = readSolutionFileErrorReturn((ifstream *)0x4ff1f9);
  }
LAB_005004fe:
  local_258 = 1;
  std::__cxx11::string::~string(local_398);
  HighsBasis::~HighsBasis
            ((HighsBasis *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0));
  HighsSolution::~HighsSolution
            ((HighsSolution *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0));
  std::__cxx11::string::~string(local_298);
  std::__cxx11::string::~string(local_278);
LAB_00500577:
  std::ifstream::~ifstream(local_248);
  return local_4;
}

Assistant:

HighsStatus readSolutionFile(const std::string filename,
                             const HighsOptions& options, HighsLp& lp,
                             HighsBasis& basis, HighsSolution& solution,
                             const HighsInt style) {
  const HighsLogOptions& log_options = options.log_options;
  if (style != kSolutionStyleRaw && style != kSolutionStyleSparse) {
    highsLogUser(log_options, HighsLogType::kError,
                 "readSolutionFile: Cannot read file of style %d\n",
                 (int)style);
    return HighsStatus::kError;
  }
  std::ifstream in_file(filename);
  if (in_file.fail()) {
    highsLogUser(log_options, HighsLogType::kError,
                 "readSolutionFile: Cannot open readable file \"%s\"\n",
                 filename.c_str());
    return HighsStatus::kError;
  }
  std::string keyword;
  std::string name;
  double value;
  HighsInt num_col;
  HighsInt num_row;
  const HighsInt lp_num_col = lp.num_col_;
  const HighsInt lp_num_row = lp.num_row_;
  // Define identifiers for reading in
  HighsSolution read_solution = solution;
  HighsBasis read_basis = basis;
  read_solution.clear();
  read_basis.clear();
  read_solution.col_value.resize(lp_num_col);
  read_solution.row_value.resize(lp_num_row);
  read_solution.col_dual.resize(lp_num_col);
  read_solution.row_dual.resize(lp_num_row);
  read_basis.col_status.resize(lp_num_col);
  read_basis.row_status.resize(lp_num_row);
  std::string section_name;
  if (!readSolutionFileIdIgnoreLineOk(section_name, in_file))
    return readSolutionFileErrorReturn(
        in_file);  // Model (status) or =obj= (value)
  const bool miplib_sol = section_name == "=obj=";
  if (miplib_sol) {
    // A MIPLIB solution file has nonzero solution values for a subset
    // of the variables identified by name, so there must be column
    // names
    if (!lp.col_names_.size()) {
      highsLogUser(log_options, HighsLogType::kError,
                   "readSolutionFile: Cannot read a MIPLIB solution file "
                   "without column names in the model\n");
      return HighsStatus::kError;
    }
    // Ensure that the col name hash table has been formed
    if (!lp.col_hash_.name2index.size()) lp.col_hash_.form(lp.col_names_);
  }
  bool sparse = false;
  if (!miplib_sol) {
    if (!readSolutionFileIgnoreLineOk(in_file))
      return readSolutionFileErrorReturn(in_file);  // Optimal
    if (!readSolutionFileIgnoreLineOk(in_file))
      return readSolutionFileErrorReturn(in_file);  //
    if (!readSolutionFileIgnoreLineOk(in_file))
      return readSolutionFileErrorReturn(in_file);  // # Primal solution values
    if (!readSolutionFileKeywordLineOk(keyword, in_file))
      return readSolutionFileErrorReturn(in_file);
    // Read in the primal solution values: return warning if there is none
    if (keyword == "None")
      return readSolutionFileReturn(HighsStatus::kWarning, solution, basis,
                                    read_solution, read_basis, in_file);
    // If there are primal solution values then keyword is the status
    // and the next line is objective
    if (!readSolutionFileIgnoreLineOk(in_file))
      return readSolutionFileErrorReturn(in_file);  // EOL
    if (!readSolutionFileIgnoreLineOk(in_file))
      return readSolutionFileErrorReturn(in_file);  // Objective
    // Next line should be "Columns" and correct number
    if (!readSolutionFileHashKeywordIntLineOk(keyword, num_col, in_file))
      return readSolutionFileErrorReturn(in_file);
    assert(keyword == "Columns");
    // The default style parameter is kSolutionStyleRaw, and this still
    // allows sparse files to be read. Recognise the latter from num_col
    // <= 0. Doesn't matter if num_col = 0, since there's nothing to
    // read either way
    sparse = num_col <= 0;
    if (style == kSolutionStyleSparse) assert(sparse);
    if (sparse) {
      num_col = -num_col;
      assert(num_col <= lp_num_col);
    } else {
      if (num_col != lp_num_col) {
        highsLogUser(log_options, HighsLogType::kError,
                     "readSolutionFile: Solution file is for %" HIGHSINT_FORMAT
                     " columns, not %" HIGHSINT_FORMAT "\n",
                     num_col, lp_num_col);
        return readSolutionFileErrorReturn(in_file);
      }
    }
  }
  if (miplib_sol) {
    HighsInt num_value = 0;
    read_solution.col_value.assign(lp_num_col, 0);
    for (;;) {
      // Only false return is for encountering EOF
      if (!readSolutionFileIdDoubleLineOk(name, value, in_file)) break;
      auto search = lp.col_hash_.name2index.find(name);
      if (search == lp.col_hash_.name2index.end()) {
        highsLogUser(log_options, HighsLogType::kError,
                     "readSolutionFile: name %s is not found\n", name.c_str());
        return HighsStatus::kError;
      } else if (search->second == kHashIsDuplicate) {
        highsLogUser(log_options, HighsLogType::kError,
                     "readSolutionFile: name %s is duplicated\n", name.c_str());
        return HighsStatus::kError;
      }
      HighsInt iCol = search->second;
      assert(lp.col_names_[iCol] == name);
      read_solution.col_value[iCol] = value;
      num_value++;
      if (in_file.eof()) break;
    }
  } else if (sparse) {
    read_solution.col_value.assign(lp_num_col, 0);
    HighsInt iCol;
    for (HighsInt iX = 0; iX < num_col; iX++) {
      if (!readSolutionFileIdDoubleIntLineOk(value, iCol, in_file))
        return readSolutionFileErrorReturn(in_file);
      read_solution.col_value[iCol] = value;
    }
  } else {
    for (HighsInt iCol = 0; iCol < num_col; iCol++) {
      if (!readSolutionFileIdDoubleLineOk(name, value, in_file))
        return readSolutionFileErrorReturn(in_file);
      read_solution.col_value[iCol] = value;
    }
  }
  read_solution.value_valid = true;
  if (sparse) {
    if (calculateRowValuesQuad(lp, read_solution.col_value,
                               read_solution.row_value) != HighsStatus::kOk)
      return readSolutionFileErrorReturn(in_file);
    return readSolutionFileReturn(HighsStatus::kOk, solution, basis,
                                  read_solution, read_basis, in_file);
  }
  // Read in the col values: OK to have none, otherwise next line
  // should be "Rows" and correct number
  if (!readSolutionFileHashKeywordIntLineOk(keyword, num_row, in_file)) {
    // Compute the row values since there are none to read
    if (calculateRowValuesQuad(lp, read_solution.col_value,
                               read_solution.row_value) != HighsStatus::kOk)
      return readSolutionFileErrorReturn(in_file);
    return readSolutionFileReturn(HighsStatus::kOk, solution, basis,
                                  read_solution, read_basis, in_file);
  }
  assert(keyword == "Rows");
  // OK to read from a file with different number of rows, since the
  // primal solution is all that's important. For example, see #1284,
  // where the user is solving a sequence of MIPs with the same number
  // of variables, but increasing numbers of constraints, and wants to
  // used the solution from one MIP as the starting solution for the
  // next.
  const bool num_row_ok = num_row == lp_num_row;
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    if (!readSolutionFileIdDoubleLineOk(name, value, in_file))
      return readSolutionFileErrorReturn(in_file);
    if (num_row_ok) read_solution.row_value[iRow] = value;
  }
  if (!num_row_ok) {
    highsLogUser(log_options, HighsLogType::kWarning,
                 "readSolutionFile: Solution file is for %" HIGHSINT_FORMAT
                 " rows, not %" HIGHSINT_FORMAT ": row values ignored\n",
                 num_row, lp_num_row);
    // Calculate the row values
    if (calculateRowValuesQuad(lp, read_solution.col_value,
                               read_solution.row_value) != HighsStatus::kOk)
      return readSolutionFileErrorReturn(in_file);
  }
  // OK to have no EOL
  if (!readSolutionFileIgnoreLineOk(in_file))
    return readSolutionFileReturn(HighsStatus::kOk, solution, basis,
                                  read_solution, read_basis,
                                  in_file);  // EOL
  // OK to have no blank line
  if (!readSolutionFileIgnoreLineOk(in_file))
    return readSolutionFileReturn(HighsStatus::kOk, solution, basis,
                                  read_solution, read_basis,
                                  in_file);  //
  // OK to have no reference to dual solution values
  if (!readSolutionFileIgnoreLineOk(in_file))
    return readSolutionFileReturn(HighsStatus::kOk, solution, basis,
                                  read_solution, read_basis,
                                  in_file);  // # Dual solution values
  // If there's a reference to dual solution values, there's a keyword
  // to indicate their status
  if (!readSolutionFileKeywordLineOk(keyword, in_file))
    return readSolutionFileErrorReturn(in_file);
  if (keyword != "None") {
    if (!readSolutionFileIgnoreLineOk(in_file))
      return readSolutionFileErrorReturn(in_file);  // EOL
    // Next line should be "Columns" and correct number
    if (!readSolutionFileHashKeywordIntLineOk(keyword, num_col, in_file))
      return readSolutionFileReturn(HighsStatus::kOk, solution, basis,
                                    read_solution, read_basis, in_file);
    assert(keyword == "Columns");
    double dual;
    for (HighsInt iCol = 0; iCol < num_col; iCol++) {
      if (!readSolutionFileIdDoubleLineOk(name, dual, in_file))
        return readSolutionFileErrorReturn(in_file);
      read_solution.col_dual[iCol] = dual;
    }
    // Read in the col values: next line should be "Rows" and correct
    // number
    if (!readSolutionFileHashKeywordIntLineOk(keyword, num_row, in_file))
      return readSolutionFileReturn(HighsStatus::kOk, solution, basis,
                                    read_solution, read_basis, in_file);
    assert(keyword == "Rows");
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      if (!readSolutionFileIdDoubleLineOk(name, dual, in_file))
        return readSolutionFileErrorReturn(in_file);
      read_solution.row_dual[iRow] = dual;
    }
  }
  // OK to have no EOL
  if (!readSolutionFileIgnoreLineOk(in_file))
    return readSolutionFileReturn(HighsStatus::kOk, solution, basis,
                                  read_solution, read_basis,
                                  in_file);  // EOL
  // OK to have no blank line
  if (!readSolutionFileIgnoreLineOk(in_file))
    return readSolutionFileReturn(HighsStatus::kOk, solution, basis,
                                  read_solution, read_basis,
                                  in_file);  //
  // OK to have no reference to basis
  if (!readSolutionFileIgnoreLineOk(in_file))
    return readSolutionFileReturn(HighsStatus::kOk, solution, basis,
                                  read_solution, read_basis,
                                  in_file);  // # Basis
  HighsStatus basis_read_status =
      readBasisStream(log_options, read_basis, in_file);
  // Return with basis read status
  return readSolutionFileReturn(basis_read_status, solution, basis,
                                read_solution, read_basis, in_file);
}